

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawTriangleFan(Vector2 *points,int pointsCount,Color color)

{
  int local_20;
  int i;
  int pointsCount_local;
  Vector2 *points_local;
  Color color_local;
  
  if (2 < pointsCount) {
    rlCheckRenderBatchLimit((pointsCount + -2) * 4);
    rlSetTexture(texShapes.id);
    rlBegin(7);
    points_local._4_1_ = color.r;
    points_local._5_1_ = color.g;
    points_local._6_1_ = color.b;
    points_local._7_1_ = color.a;
    rlColor4ub(points_local._4_1_,points_local._5_1_,points_local._6_1_,points_local._7_1_);
    for (local_20 = 1; local_20 < pointsCount + -1; local_20 = local_20 + 1) {
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(points->x,points->y);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(points[local_20].x,points[local_20].y);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(points[local_20 + 1].x,points[local_20 + 1].y);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(points[local_20 + 1].x,points[local_20 + 1].y);
    }
    rlEnd();
    rlSetTexture(0);
  }
  return;
}

Assistant:

void DrawTriangleFan(Vector2 *points, int pointsCount, Color color)
{
    if (pointsCount >= 3)
    {
        rlCheckRenderBatchLimit((pointsCount - 2)*4);

        rlSetTexture(texShapes.id);
        rlBegin(RL_QUADS);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 1; i < pointsCount - 1; i++)
            {
                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(points[0].x, points[0].y);

                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(points[i].x, points[i].y);

                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);

                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(points[i + 1].x, points[i + 1].y);
            }
        rlEnd();
        rlSetTexture(0);
    }
}